

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O0

ai_real __thiscall
Assimp::ImproveCacheLocalityProcess::ProcessMesh
          (ImproveCacheLocalityProcess *this,aiMesh *pMesh,uint meshNum)

{
  allocator<bool> *this_00;
  uint uVar1;
  uint uVar2;
  aiFace *paVar3;
  undefined1 auVar4 [16];
  uint *__first;
  bool bVar5;
  LogSeverity LVar6;
  Logger *pLVar7;
  ulong uVar8;
  uint *puVar9;
  void *__s;
  _Bit_pointer puVar10;
  const_reference pvVar11;
  reference pvVar12;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar13;
  basic_formatter *this_01;
  reference rVar14;
  uint *ind_1;
  aiFace *paStack_3f0;
  uint nind_1;
  aiFace *pcFace_2;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string local_268;
  float local_244;
  uint local_240;
  ai_real fACMR2;
  uint iCachedIdx;
  uint tmp;
  int priority;
  uint dp_1;
  uint *piCur_2;
  undefined1 auStack_220 [4];
  int max_priority;
  _Bit_type local_218;
  uint local_20c;
  uint local_208;
  uint dp;
  uint ind;
  uint nind;
  aiFace *pcFace_1;
  _Bit_type local_1f0;
  uint local_1e8;
  uint local_1e4;
  uint fidx;
  uint tri;
  uint *piCurCandidate;
  uint *piList;
  int local_1c8;
  uint icnt;
  int iStampCnt;
  int ics;
  int ivdx;
  uint iCacheMisses;
  uint *piCandidates;
  uint *piCurEnd_1;
  uint *piCur_1;
  uint iMaxRefTris;
  vector<unsigned_int,_std::allocator<unsigned_int>_> piNumTriPtrNoModify;
  uint *piNumTriPtr;
  stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> sDeadEndVStack;
  undefined1 local_158 [8];
  vector<bool,_std::allocator<bool>_> abEmitted;
  uint *piCSIter;
  uint *piIBOutput;
  uint iIdxCnt;
  uint *piCachingStamps;
  VertexTriangleAdjacency adj;
  char szBuff [128];
  uint *pp;
  bool bInCache;
  aiFace *paStack_58;
  uint qq;
  aiFace *pcFace;
  uint iCacheMisses_1;
  uint *piCurEnd;
  uint *piCur;
  uint *piFIFOStack;
  aiFace *pcEnd;
  ai_real fACMR;
  uint meshNum_local;
  aiMesh *pMesh_local;
  ImproveCacheLocalityProcess *this_local;
  
  pcEnd._4_4_ = meshNum;
  _fACMR = pMesh;
  pMesh_local = (aiMesh *)this;
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                  ,0x7a,
                  "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                 );
  }
  bVar5 = aiMesh::HasFaces(pMesh);
  if ((bVar5) && (bVar5 = aiMesh::HasPositions(_fACMR), bVar5)) {
    if (_fACMR->mPrimitiveTypes == 4) {
      if (this->mConfigCacheDepth < _fACMR->mNumVertices) {
        pcEnd._0_4_ = 3.0;
        paVar3 = _fACMR->mFaces;
        uVar1 = _fACMR->mNumFaces;
        bVar5 = DefaultLogger::isNullLogger();
        if (!bVar5) {
          auVar4 = ZEXT416(this->mConfigCacheDepth) * ZEXT816(4);
          uVar8 = auVar4._0_8_;
          if (auVar4._8_8_ != 0) {
            uVar8 = 0xffffffffffffffff;
          }
          puVar9 = (uint *)operator_new__(uVar8);
          memset(puVar9,0xff,(ulong)this->mConfigCacheDepth << 2);
          uVar2 = this->mConfigCacheDepth;
          pcFace._4_4_ = 0;
          piCurEnd = puVar9;
          for (paStack_58 = _fACMR->mFaces; paStack_58 != paVar3 + uVar1;
              paStack_58 = paStack_58 + 1) {
            for (pp._4_4_ = 0; pp._4_4_ < 3; pp._4_4_ = pp._4_4_ + 1) {
              bVar5 = false;
              for (szBuff._120_8_ = puVar9; (ulong)szBuff._120_8_ < puVar9 + uVar2;
                  szBuff._120_8_ = szBuff._120_8_ + 4) {
                if (*(uint *)szBuff._120_8_ == paStack_58->mIndices[pp._4_4_]) {
                  bVar5 = true;
                  break;
                }
              }
              if (!bVar5) {
                pcFace._4_4_ = pcFace._4_4_ + 1;
                if (puVar9 + uVar2 == piCurEnd) {
                  piCurEnd = puVar9;
                }
                *piCurEnd = paStack_58->mIndices[pp._4_4_];
                piCurEnd = piCurEnd + 1;
              }
            }
          }
          if (puVar9 != (uint *)0x0) {
            operator_delete__(puVar9);
          }
          pcEnd._0_4_ = (float)pcFace._4_4_ / (float)_fACMR->mNumFaces;
          if ((pcEnd._0_4_ == 3.0) && (!NAN(pcEnd._0_4_))) {
            snprintf((char *)&adj.mNumVertices,0x80,"Mesh %u: Not suitable for vcache optimization",
                     (ulong)pcEnd._4_4_);
            pLVar7 = DefaultLogger::get();
            Logger::warn(pLVar7,(char *)&adj.mNumVertices);
            return 0.0;
          }
        }
        VertexTriangleAdjacency::VertexTriangleAdjacency
                  ((VertexTriangleAdjacency *)&piCachingStamps,_fACMR->mFaces,_fACMR->mNumFaces,
                   _fACMR->mNumVertices,true);
        __s = operator_new__((ulong)_fACMR->mNumVertices << 2);
        memset(__s,0,(ulong)_fACMR->mNumVertices << 2);
        puVar10 = (_Bit_pointer)operator_new__((ulong)(_fACMR->mNumFaces * 3) << 2);
        uVar2 = _fACMR->mNumFaces;
        sDeadEndVStack.c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        this_00 = (allocator<bool> *)
                  ((long)&sDeadEndVStack.c.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 6);
        abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = puVar10;
        std::allocator<bool>::allocator(this_00);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_158,(ulong)uVar2,
                   (bool *)((long)&sDeadEndVStack.c.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
        std::allocator<bool>::~allocator
                  ((allocator<bool> *)
                   ((long)&sDeadEndVStack.c.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 6));
        std::stack<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
        stack<std::vector<unsigned_int,std::allocator<unsigned_int>>,void>
                  ((stack<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>> *)
                   &piNumTriPtr);
        __first = adj.mAdjacencyTable;
        piNumTriPtrNoModify.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = adj.mAdjacencyTable;
        puVar9 = adj.mAdjacencyTable + _fACMR->mNumVertices;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&piCur_1 + 7));
        std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&iMaxRefTris,__first,puVar9,
                   (allocator<unsigned_int> *)((long)&piCur_1 + 7));
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&piCur_1 + 7));
        piCur_1._0_4_ = 0;
        piCurEnd_1 = adj.mAdjacencyTable;
        piCandidates = adj.mAdjacencyTable + _fACMR->mNumVertices;
        for (; piCurEnd_1 != piCandidates; piCurEnd_1 = piCurEnd_1 + 1) {
          puVar9 = std::max<unsigned_int>((uint *)&piCur_1,piCurEnd_1);
          piCur_1._0_4_ = *puVar9;
        }
        if ((uint)piCur_1 == 0) {
          __assert_fail("iMaxRefTris > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                        ,0xda,
                        "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                       );
        }
        _ivdx = (uint *)operator_new__((ulong)((uint)piCur_1 * 3) << 2);
        ics = 0;
        iStampCnt = 0;
        icnt = 1;
        local_1c8 = this->mConfigCacheDepth + 1;
        uVar2 = iStampCnt;
LAB_001962a0:
        iStampCnt = uVar2;
        if (-1 < iStampCnt) {
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iMaxRefTris,
                               (long)iStampCnt);
          piList._4_4_ = *pvVar11;
          piCurCandidate =
               VertexTriangleAdjacency::GetAdjacentTriangles
                         ((VertexTriangleAdjacency *)&piCachingStamps,iStampCnt);
          _fidx = _ivdx;
          for (local_1e4 = 0; local_1e4 < piList._4_4_; local_1e4 = local_1e4 + 1) {
            local_1e8 = *piCurCandidate;
            piCurCandidate = piCurCandidate + 1;
            rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_158,(ulong)local_1e8);
            local_1f0 = rVar14._M_mask;
            pcFace_1 = (aiFace *)rVar14._M_p;
            bVar5 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&pcFace_1);
            if (((bVar5 ^ 0xffU) & 1) != 0) {
              _ind = _fACMR->mFaces + local_1e8;
              dp = _ind->mNumIndices;
              for (local_208 = 0; local_208 < dp; local_208 = local_208 + 1) {
                local_20c = _ind->mIndices[local_208];
                if (iStampCnt != local_20c) {
                  std::
                  stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  push((stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&piNumTriPtr,&local_20c);
                  *_fidx = local_20c;
                  piNumTriPtrNoModify.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[local_20c] =
                       piNumTriPtrNoModify.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[local_20c] - 1;
                  _fidx = _fidx + 1;
                }
                *(uint *)abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage = local_20c;
                if (this->mConfigCacheDepth <
                    (uint)(local_1c8 - *(int *)((long)__s + (ulong)local_20c * 4))) {
                  *(int *)((long)__s + (ulong)local_20c * 4) = local_1c8;
                  ics = ics + 1;
                  local_1c8 = local_1c8 + 1;
                }
                abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage =
                     (_Bit_pointer)
                     ((long)abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage + 4);
              }
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_158,(ulong)local_1e8)
              ;
              _auStack_220 = rVar14;
              std::_Bit_reference::operator=((_Bit_reference *)auStack_220,true);
            }
          }
          piNumTriPtrNoModify.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[iStampCnt] = 0;
          iStampCnt = -1;
          piCur_2._4_4_ = 0xffffffff;
          for (_priority = _ivdx; _priority != _fidx; _priority = _priority + 1) {
            tmp = *_priority;
            if (piNumTriPtrNoModify.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage[tmp] != 0) {
              iCachedIdx = 0;
              fACMR2 = (ai_real)(local_1c8 - *(int *)((long)__s + (ulong)tmp * 4));
              if ((int)fACMR2 +
                  piNumTriPtrNoModify.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[tmp] * 2 <= this->mConfigCacheDepth) {
                iCachedIdx = (uint)fACMR2;
              }
              if ((int)piCur_2._4_4_ < (int)iCachedIdx) {
                piCur_2._4_4_ = iCachedIdx;
                iStampCnt = tmp;
              }
            }
          }
          uVar2 = iStampCnt;
          if (iStampCnt == -1) {
            do {
              bVar5 = std::
                      stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::empty((stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&piNumTriPtr);
              if (((bVar5 ^ 0xffU) & 1) == 0) goto LAB_001966bf;
              pvVar12 = std::
                        stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::top((stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&piNumTriPtr);
              local_240 = *pvVar12;
              std::stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              pop((stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  &piNumTriPtr);
            } while (piNumTriPtrNoModify.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[local_240] == 0);
            iStampCnt = local_240;
LAB_001966bf:
            uVar2 = iStampCnt;
            if (iStampCnt == -1) {
              do {
                uVar2 = iStampCnt;
                if ((int)_fACMR->mNumVertices <= (int)icnt) break;
                icnt = icnt + 1;
                uVar2 = icnt;
              } while (piNumTriPtrNoModify.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[(int)icnt] == 0);
            }
          }
          goto LAB_001962a0;
        }
        local_244 = 0.0;
        bVar5 = DefaultLogger::isNullLogger();
        if (!bVar5) {
          local_244 = (float)(uint)ics / (float)_fACMR->mNumFaces;
          pLVar7 = DefaultLogger::get();
          LVar6 = Logger::getLogSeverity(pLVar7);
          if (LVar6 == VERBOSE) {
            pLVar7 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[20]>(&local_3e0,(char (*) [20])"Mesh %u | ACMR in: ");
            pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )&local_3e0,(uint *)((long)&pcEnd + 4));
            pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar13,(char (*) [7])" out: ");
            pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar13,(float *)&pcEnd);
            pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar13,(char (*) [5])" | ~");
            pbVar13 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar13,&local_244);
            pcFace_2._4_4_ = ((pcEnd._0_4_ - local_244) / pcEnd._0_4_) * 100.0;
            this_01 = (basic_formatter *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar13,(float *)((long)&pcFace_2 + 4));
            Formatter::basic_formatter::operator_cast_to_string(&local_268,this_01);
            Logger::debug(pLVar7,&local_268);
            std::__cxx11::string::~string((string *)&local_268);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_3e0);
          }
          local_244 = (float)_fACMR->mNumFaces * local_244;
        }
        abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = puVar10;
        for (paStack_3f0 = _fACMR->mFaces; paStack_3f0 != paVar3 + uVar1;
            paStack_3f0 = paStack_3f0 + 1) {
          uVar2 = paStack_3f0->mNumIndices;
          puVar9 = paStack_3f0->mIndices;
          if (uVar2 != 0) {
            *puVar9 = (uint)*abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage;
            abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage =
                 (_Bit_pointer)
                 ((long)abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage + 4);
          }
          if (1 < uVar2) {
            puVar9[1] = (uint)*abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage;
            abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage =
                 (_Bit_pointer)
                 ((long)abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage + 4);
          }
          if (2 < uVar2) {
            puVar9[2] = (uint)*abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage;
            abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage =
                 (_Bit_pointer)
                 ((long)abEmitted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage + 4);
          }
        }
        if (__s != (void *)0x0) {
          operator_delete__(__s);
        }
        if (puVar10 != (_Bit_pointer)0x0) {
          operator_delete__(puVar10);
        }
        if (_ivdx != (uint *)0x0) {
          operator_delete__(_ivdx);
        }
        this_local._4_4_ = local_244;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iMaxRefTris);
        std::stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
                  ((stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                   )&piNumTriPtr);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)local_158);
        VertexTriangleAdjacency::~VertexTriangleAdjacency
                  ((VertexTriangleAdjacency *)&piCachingStamps);
      }
      else {
        this_local._4_4_ = 0.0;
      }
    }
    else {
      pLVar7 = DefaultLogger::get();
      Logger::error(pLVar7,"This algorithm works on triangle meshes only");
      this_local._4_4_ = 0.0;
    }
  }
  else {
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

ai_real ImproveCacheLocalityProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshNum) {
    // TODO: rewrite this to use std::vector or boost::shared_array
    ai_assert(nullptr != pMesh);

    // Check whether the input data is valid
    // - there must be vertices and faces
    // - all faces must be triangulated or we can't operate on them
    if (!pMesh->HasFaces() || !pMesh->HasPositions())
        return static_cast<ai_real>(0.f);

    if (pMesh->mPrimitiveTypes != aiPrimitiveType_TRIANGLE) {
        ASSIMP_LOG_ERROR("This algorithm works on triangle meshes only");
        return static_cast<ai_real>(0.f);
    }

    if(pMesh->mNumVertices <= mConfigCacheDepth) {
        return static_cast<ai_real>(0.f);
    }

    ai_real fACMR = 3.f;
    const aiFace* const pcEnd = pMesh->mFaces+pMesh->mNumFaces;

    // Input ACMR is for logging purposes only
    if (!DefaultLogger::isNullLogger())     {

        unsigned int* piFIFOStack = new unsigned int[mConfigCacheDepth];
        memset(piFIFOStack,0xff,mConfigCacheDepth*sizeof(unsigned int));
        unsigned int* piCur = piFIFOStack;
        const unsigned int* const piCurEnd = piFIFOStack + mConfigCacheDepth;

        // count the number of cache misses
        unsigned int iCacheMisses = 0;
        for (const aiFace* pcFace = pMesh->mFaces;pcFace != pcEnd;++pcFace) {
            for (unsigned int qq = 0; qq < 3;++qq) {
                bool bInCache = false;
                for (unsigned int* pp = piFIFOStack;pp < piCurEnd;++pp) {
                    if (*pp == pcFace->mIndices[qq])    {
                        // the vertex is in cache
                        bInCache = true;
                        break;
                    }
                }
                if (!bInCache)  {
                    ++iCacheMisses;
                    if (piCurEnd == piCur) {
                        piCur = piFIFOStack;
                    }
                    *piCur++ = pcFace->mIndices[qq];
                }
            }
        }
        delete[] piFIFOStack;
        fACMR = (ai_real) iCacheMisses / pMesh->mNumFaces;
        if (3.0 == fACMR)   {
            char szBuff[128]; // should be sufficiently large in every case

            // the JoinIdenticalVertices process has not been executed on this
            // mesh, otherwise this value would normally be at least minimally
            // smaller than 3.0 ...
            ai_snprintf(szBuff,128,"Mesh %u: Not suitable for vcache optimization",meshNum);
            ASSIMP_LOG_WARN(szBuff);
            return static_cast<ai_real>(0.f);
        }
    }

    // first we need to build a vertex-triangle adjacency list
    VertexTriangleAdjacency adj(pMesh->mFaces,pMesh->mNumFaces, pMesh->mNumVertices,true);

    // build a list to store per-vertex caching time stamps
    unsigned int* const piCachingStamps = new unsigned int[pMesh->mNumVertices];
    memset(piCachingStamps,0x0,pMesh->mNumVertices*sizeof(unsigned int));

    // allocate an empty output index buffer. We store the output indices in one large array.
    // Since the number of triangles won't change the input faces can be reused. This is how
    // we save thousands of redundant mini allocations for aiFace::mIndices
    const unsigned int iIdxCnt = pMesh->mNumFaces*3;
    unsigned int* const piIBOutput = new unsigned int[iIdxCnt];
    unsigned int* piCSIter = piIBOutput;

    // allocate the flag array to hold the information
    // whether a face has already been emitted or not
    std::vector<bool> abEmitted(pMesh->mNumFaces,false);

    // dead-end vertex index stack
    std::stack<unsigned int, std::vector<unsigned int> > sDeadEndVStack;

    // create a copy of the piNumTriPtr buffer
    unsigned int* const piNumTriPtr = adj.mLiveTriangles;
    const std::vector<unsigned int> piNumTriPtrNoModify(piNumTriPtr, piNumTriPtr + pMesh->mNumVertices);

    // get the largest number of referenced triangles and allocate the "candidate buffer"
    unsigned int iMaxRefTris = 0; {
        const unsigned int* piCur = adj.mLiveTriangles;
        const unsigned int* const piCurEnd = adj.mLiveTriangles+pMesh->mNumVertices;
        for (;piCur != piCurEnd;++piCur) {
            iMaxRefTris = std::max(iMaxRefTris,*piCur);
        }
    }
    ai_assert(iMaxRefTris > 0);
    unsigned int* piCandidates = new unsigned int[iMaxRefTris*3];
    unsigned int iCacheMisses = 0;

    // ...................................................................................
    /** PSEUDOCODE for the algorithm

        A = Build-Adjacency(I) Vertex-triangle adjacency
        L = Get-Triangle-Counts(A) Per-vertex live triangle counts
        C = Zero(Vertex-Count(I)) Per-vertex caching time stamps
        D = Empty-Stack() Dead-end vertex stack
        E = False(Triangle-Count(I)) Per triangle emitted flag
        O = Empty-Index-Buffer() Empty output buffer
        f = 0 Arbitrary starting vertex
        s = k+1, i = 1 Time stamp and cursor
        while f >= 0 For all valid fanning vertices
            N = Empty-Set() 1-ring of next candidates
            for each Triangle t in Neighbors(A, f)
                if !Emitted(E,t)
                    for each Vertex v in t
                        Append(O,v) Output vertex
                        Push(D,v) Add to dead-end stack
                        Insert(N,v) Register as candidate
                        L[v] = L[v]-1 Decrease live triangle count
                        if s-C[v] > k If not in cache
                            C[v] = s Set time stamp
                            s = s+1 Increment time stamp
                    E[t] = true Flag triangle as emitted
            Select next fanning vertex
            f = Get-Next-Vertex(I,i,k,N,C,s,L,D)
        return O
        */
    // ...................................................................................

    int ivdx = 0;
    int ics = 1;
    int iStampCnt = mConfigCacheDepth+1;
    while (ivdx >= 0)   {

        unsigned int icnt = piNumTriPtrNoModify[ivdx];
        unsigned int* piList = adj.GetAdjacentTriangles(ivdx);
        unsigned int* piCurCandidate = piCandidates;

        // get all triangles in the neighborhood
        for (unsigned int tri = 0; tri < icnt;++tri)    {

            // if they have not yet been emitted, add them to the output IB
            const unsigned int fidx = *piList++;
            if (!abEmitted[fidx])   {

                // so iterate through all vertices of the current triangle
                const aiFace* pcFace = &pMesh->mFaces[ fidx ];
                unsigned nind = pcFace->mNumIndices;
                for (unsigned ind = 0; ind < nind; ind++) {
                    unsigned dp = pcFace->mIndices[ind];

                    // the current vertex won't have any free triangles after this step
                    if (ivdx != (int)dp) {
                        // append the vertex to the dead-end stack
                        sDeadEndVStack.push(dp);

                        // register as candidate for the next step
                        *piCurCandidate++ = dp;

                        // decrease the per-vertex triangle counts
                        piNumTriPtr[dp]--;
                    }

                    // append the vertex to the output index buffer
                    *piCSIter++ = dp;

                    // if the vertex is not yet in cache, set its cache count
                    if (iStampCnt-piCachingStamps[dp] > mConfigCacheDepth) {
                        piCachingStamps[dp] = iStampCnt++;
                        ++iCacheMisses;
                    }
                }
                // flag triangle as emitted
                abEmitted[fidx] = true;
            }
        }

        // the vertex has now no living adjacent triangles anymore
        piNumTriPtr[ivdx] = 0;

        // get next fanning vertex
        ivdx = -1;
        int max_priority = -1;
        for (unsigned int* piCur = piCandidates;piCur != piCurCandidate;++piCur)    {
            const unsigned int dp = *piCur;

            // must have live triangles
            if (piNumTriPtr[dp] > 0)    {
                int priority = 0;

                // will the vertex be in cache, even after fanning occurs?
                unsigned int tmp;
                if ((tmp = iStampCnt-piCachingStamps[dp]) + 2*piNumTriPtr[dp] <= mConfigCacheDepth) {
                    priority = tmp;
                }

                // keep best candidate
                if (priority > max_priority) {
                    max_priority = priority;
                    ivdx = dp;
                }
            }
        }
        // did we reach a dead end?
        if (-1 == ivdx) {
            // need to get a non-local vertex for which we have a good chance that it is still
            // in the cache ...
            while (!sDeadEndVStack.empty()) {
                unsigned int iCachedIdx = sDeadEndVStack.top();
                sDeadEndVStack.pop();
                if (piNumTriPtr[ iCachedIdx ] > 0)  {
                    ivdx = iCachedIdx;
                    break;
                }
            }

            if (-1 == ivdx) {
                // well, there isn't such a vertex. Simply get the next vertex in input order and
                // hope it is not too bad ...
                while (ics < (int)pMesh->mNumVertices)  {
                    ++ics;
                    if (piNumTriPtr[ics] > 0)   {
                        ivdx = ics;
                        break;
                    }
                }
            }
        }
    }
    ai_real fACMR2 = 0.0f;
    if (!DefaultLogger::isNullLogger()) {
        fACMR2 = (float)iCacheMisses / pMesh->mNumFaces;

        // very intense verbose logging ... prepare for much text if there are many meshes
        if ( DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE) {
            ASSIMP_LOG_DEBUG_F("Mesh %u | ACMR in: ", meshNum, " out: ", fACMR, " | ~", fACMR2, ((fACMR - fACMR2) / fACMR) * 100.f);
        }

        fACMR2 *= pMesh->mNumFaces;
    }
    // sort the output index buffer back to the input array
    piCSIter = piIBOutput;
    for (aiFace* pcFace = pMesh->mFaces; pcFace != pcEnd;++pcFace)  {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) ind[0] = *piCSIter++;
        if (nind > 1) ind[1] = *piCSIter++;
        if (nind > 2) ind[2] = *piCSIter++;
    }

    // delete temporary storage
    delete[] piCachingStamps;
    delete[] piIBOutput;
    delete[] piCandidates;

    return fACMR2;
}